

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O3

void __thiscall entities::Label::~Label(Label *this)

{
  pointer pVVar1;
  pointer puVar2;
  uint tileIndex;
  logger *this_00;
  Chunk *pCVar3;
  LodRenderer *pLVar4;
  repr coords;
  
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0027a2b0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0027a2e8;
  this_00 = spdlog::default_logger_raw();
  spdlog::logger::log(this_00,0.0);
  pCVar3 = Entity::getChunk(&this->super_Entity);
  pLVar4 = Chunk::getLodRenderer(pCVar3);
  if (pLVar4 != (LodRenderer *)0x0) {
    pCVar3 = Entity::getChunk(&this->super_Entity);
    pLVar4 = Chunk::getLodRenderer(pCVar3);
    pCVar3 = Entity::getChunk(&this->super_Entity);
    coords = Chunk::getCoords(pCVar3);
    tileIndex = Entity::getIndex(&this->super_Entity);
    LodRenderer::removeDecoration(pLVar4,coords,tileIndex,&this->super_Drawable);
  }
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_0027d7a8;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_0027d7d0;
  (this->text_).m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_0027d828;
  pVVar1 = (this->text_).m_outlineVertices.m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  (this->text_).m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_0027d828;
  pVVar1 = (this->text_).m_vertices.m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  puVar2 = (this->text_).m_string.m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar2 != &(this->text_).m_string.m_string.field_2) {
    operator_delete(puVar2);
  }
  sf::Transformable::~Transformable(&(this->text_).super_Transformable);
  return;
}

Assistant:

Label::~Label() {
    spdlog::debug("Label entity has been destroyed.");
    if (getChunk().getLodRenderer() != nullptr) {
        getChunk().getLodRenderer()->removeDecoration(getChunk().getCoords(), getIndex(), this);
    }
}